

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void RAWToRGB24Row_SSSE3(uint8_t *src_raw,uint8_t *dst_rgb24,int width)

{
  bool bVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  uvec8 auVar4;
  uvec8 auVar5;
  uvec8 auVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar6 = libyuv::kShuffleMaskRAWToRGB24_2;
  auVar5 = libyuv::kShuffleMaskRAWToRGB24_1;
  auVar4 = libyuv::kShuffleMaskRAWToRGB24_0;
  do {
    auVar8 = *(undefined1 (*) [16])src_raw;
    puVar2 = *(undefined1 (*) [16])src_raw;
    puVar3 = *(undefined1 (*) [16])src_raw;
    src_raw = *(undefined1 (*) [16])((long)src_raw + 0x10) + 8;
    auVar8 = pshufb(auVar8,(undefined1  [16])auVar4);
    auVar9 = pshufb(*(undefined1 (*) [16])(puVar2 + 4),(undefined1  [16])auVar5);
    auVar10 = pshufb(*(undefined1 (*) [16])(puVar3 + 8),(undefined1  [16])auVar6);
    *(long *)dst_rgb24 = auVar8._0_8_;
    *(long *)(dst_rgb24 + 8) = auVar9._0_8_;
    *(long *)(dst_rgb24 + 0x10) = auVar10._0_8_;
    dst_rgb24 = dst_rgb24 + 0x18;
    iVar7 = width + -8;
    bVar1 = 7 < width;
    width = iVar7;
  } while (iVar7 != 0 && bVar1);
  return;
}

Assistant:

void RAWToRGB24Row_SSSE3(const uint8_t* src_raw,
                         uint8_t* dst_rgb24,
                         int width) {
  asm volatile(
      "movdqa      %3,%%xmm3                     \n"
      "movdqa      %4,%%xmm4                     \n"
      "movdqa      %5,%%xmm5                     \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x4(%0),%%xmm1                \n"
      "movdqu      0x8(%0),%%xmm2                \n"
      "lea         0x18(%0),%0                   \n"
      "pshufb      %%xmm3,%%xmm0                 \n"
      "pshufb      %%xmm4,%%xmm1                 \n"
      "pshufb      %%xmm5,%%xmm2                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "movq        %%xmm1,0x8(%1)                \n"
      "movq        %%xmm2,0x10(%1)               \n"
      "lea         0x18(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_raw),                  // %0
        "+r"(dst_rgb24),                // %1
        "+r"(width)                     // %2
      : "m"(kShuffleMaskRAWToRGB24_0),  // %3
        "m"(kShuffleMaskRAWToRGB24_1),  // %4
        "m"(kShuffleMaskRAWToRGB24_2)   // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}